

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<double>::TPZBlockDiagonal
          (TPZBlockDiagonal<double> *this,void **vtt,TPZVec<int> *blocksizes,
          TPZFMatrix<double> *glob)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t newsize;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  long local_78;
  double local_38;
  
  *(undefined8 *)((long)&(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 2) = 0;
  *(undefined8 *)((long)&(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol + 2) = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fStorage).fStore = (double *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  (this->fBlockPos)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fBlockPos).fStore = (long *)0x0;
  (this->fBlockPos).fNElements = 0;
  (this->fBlockPos).fNAlloc = 0;
  TPZVec<int>::TPZVec(&this->fBlockSize,blocksizes);
  lVar2 = blocksizes->fNElements;
  local_38 = 0.0;
  TPZVec<long>::Resize(&this->fBlockPos,lVar2 + 1,(long *)&local_38);
  if (lVar2 < 1) {
    newsize = 0;
    lVar6 = 0;
  }
  else {
    piVar3 = blocksizes->fStore;
    plVar4 = (this->fBlockPos).fStore;
    lVar5 = *plVar4;
    lVar6 = 0;
    newsize = 0;
    lVar8 = 0;
    do {
      iVar1 = piVar3[lVar8];
      lVar6 = lVar6 + iVar1;
      lVar5 = lVar5 + (ulong)(uint)(iVar1 * iVar1);
      plVar4[lVar8 + 1] = lVar5;
      lVar8 = lVar8 + 1;
      newsize = newsize + (ulong)(uint)(iVar1 * iVar1);
    } while (lVar2 != lVar8);
  }
  local_38 = 0.0;
  TPZVec<double>::Resize(&this->fStorage,newsize,&local_38);
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = lVar6;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = lVar6;
  if (0 < lVar2) {
    local_78 = 0;
    lVar6 = 0;
    do {
      lVar5 = (long)(this->fBlockSize).fStore[lVar6];
      if (0 < lVar5) {
        lVar9 = (this->fBlockPos).fStore[lVar6] << 3;
        lVar8 = 0;
        do {
          lVar7 = local_78;
          lVar10 = lVar9;
          lVar11 = lVar5;
          do {
            (*(glob->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x24])(glob,lVar8 + local_78,lVar7);
            *(ulong *)((long)(this->fStorage).fStore + lVar10) =
                 CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
            lVar10 = lVar10 + lVar5 * 8;
            lVar7 = lVar7 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 8;
        } while (lVar8 != lVar5);
      }
      local_78 = local_78 + lVar5;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksizes, const TPZFMatrix<TVar> &glob)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fBlockSize(blocksizes)
{
	int64_t nblock = blocksizes.NElements();
	fBlockPos.Resize(nblock+1,0);
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksizes[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
	fStorage.Resize(ndata,0.);
	this->fRow = neq;
	this->fCol = neq;
	int64_t pos;
	int64_t eq = 0, r, c;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		pos = fBlockPos[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				fStorage[pos+r+bsize*c]= glob.GetVal(eq+r,eq+c);
			}
		}
		eq += bsize;
	}
	
}